

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O0

bool __thiscall EditDistance::propagate(EditDistance *this)

{
  Reason r_00;
  bool bVar1;
  int *piVar2;
  int64_t iVar3;
  long in_RDI;
  EdExplFinder edExplFinder;
  Clause *r;
  int i_1;
  int editDistanceLB;
  int i;
  int ub;
  IntView<0> *in_stack_00000148;
  vec<int> *in_stack_00000150;
  vec<int> *in_stack_00000158;
  vec<int> *in_stack_00000160;
  int in_stack_0000016c;
  EdExplFinder *in_stack_00000170;
  IntView<0> *in_stack_00000180;
  vec<int> *in_stack_00000188;
  int in_stack_00000190;
  int in_stack_00000198;
  int in_stack_000001a0;
  int64_t in_stack_fffffffffffffef8;
  undefined1 channel;
  EditDistance *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff1c;
  Tint *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  int upperBound;
  EditDistance *in_stack_ffffffffffffff30;
  Reason local_b0 [3];
  EdExplFinder local_98;
  Clause *local_48;
  int local_40;
  int local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  upperBound = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_30 = *(int *)(in_RDI + 0x50) * 2 * *(int *)(in_RDI + 0x18);
  local_34 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x7c));
  local_34 = local_34 + *(int *)(in_RDI + 0x90) * 2 * *(int *)(in_RDI + 0x18);
  piVar2 = std::min<int>(&local_30,&local_34);
  local_2c = *piVar2;
  updateDpMatrix(in_stack_ffffffffffffff30,upperBound);
  *(undefined4 *)(in_RDI + 0x90) = 0;
  for (local_38 = 0;
      SBORROW4(local_38,*(int *)(in_RDI + 0x50) * 2) !=
      (int)(local_38 + *(int *)(in_RDI + 0x50) * -2) < 0; local_38 = local_38 + 1) {
    piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x98),local_38);
    *piVar2 = 0;
  }
  local_3c = getEditDistanceLB(in_stack_ffffffffffffff00);
  Tint::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  iVar3 = IntView<0>::getMin((IntView<0> *)in_stack_ffffffffffffff00);
  if (iVar3 < local_3c) {
    if (*(int *)(in_RDI + 0x78) == 0) {
      for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x50); local_40 = local_40 + 1) {
        bVar1 = IntView<0>::isFixed((IntView<0> *)0x1d9c9f);
        if ((!bVar1) || (bVar1 = IntView<0>::isFixed((IntView<0> *)0x1d9cc2), !bVar1)) {
          return true;
        }
      }
    }
    bVar1 = IntView<0>::setMinNotR
                      ((IntView<0> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    channel = (undefined1)((ulong)in_stack_fffffffffffffef8 >> 0x38);
    if ((bVar1) && (local_48 = (Clause *)0x0, (so.lazy & 1U) != 0)) {
      if (*(int *)(in_RDI + 0x78) == 0) {
        local_48 = getNaiveExplanation(in_stack_ffffffffffffff30);
      }
      else if (*(int *)(in_RDI + 0x78) == 1) {
        EdExplFinder::EdExplFinder(&local_98);
        channel = (undefined1)((ulong)*(undefined8 *)(in_RDI + 0x60) >> 0x38);
        in_stack_ffffffffffffff00 = (EditDistance *)(in_RDI + 0x80);
        in_stack_ffffffffffffff10 = *(undefined4 *)(in_RDI + 0x50);
        in_stack_ffffffffffffff08 = local_3c;
        local_48 = EdExplFinder::FindEdExplanation
                             (in_stack_00000170,in_stack_0000016c,in_stack_00000160,
                              in_stack_00000158,in_stack_00000150,in_stack_00000148,
                              in_stack_00000180,in_stack_00000188,in_stack_00000190,
                              in_stack_00000198,in_stack_000001a0);
        EdExplFinder::~EdExplFinder((EdExplFinder *)0x1d9de2);
      }
      Reason::Reason(local_b0,local_48);
      r_00.field_0._a._4_4_ = in_stack_ffffffffffffff14;
      r_00.field_0._a._0_4_ = in_stack_ffffffffffffff10;
      bVar1 = IntView<0>::setMin((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                 (int64_t)in_stack_ffffffffffffff00,r_00,(bool)channel);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		// Step 1:
		// Update dp matrix according to change
		//

#ifndef NDEBUG
		std::cout << "lastBound = " << lastBound << '\n';
		std::cout << "cellChanges = " << cellChanges << '\n';
		std::cout << "cellHasChanged = [";
		for (int i = 0; i < seqSize * 2; i++) {
			std::cout << cellHasChanged[i] << " ";
		}
		std::cout << "]" << '\n';
#endif

		const int ub = std::min(2 * seqSize * max_id_cost, lastBound + cellChanges * 2 * max_id_cost);

		updateDpMatrix(ub);
		cellChanges = 0;
		for (int i = 0; i < seqSize * 2; i++) {
			cellHasChanged[i] = 0;
		}

#ifndef NDEBUG
		printCurrentDpMatrix();
#endif

		// Step 2:
		// Propagate lower bound to edit distance, and add explanation
		//

		// calc edit distance
		const int editDistanceLB = getEditDistanceLB();

		lastBound = editDistanceLB;

		if (ed.getMin() < editDistanceLB) {
#ifndef NDEBUG
			std::cout << "ED " << editDistanceLB << '\n';
#endif

			if (explLevel == E_NAIVE) {
				// in case of naive explanation, check if all variables are fixed
				for (int i = 0; i < seqSize; i++) {
					if (!seq1[i].isFixed() || !seq2[i].isFixed()) {
						return true;
					}
				}
			}
			if (ed.setMinNotR(editDistanceLB)) {
				Clause* r = nullptr;
				if (so.lazy) {
					switch (explLevel) {
						case E_NAIVE:
							r = getNaiveExplanation();
							break;
						case E_FULL:
							EdExplFinder edExplFinder;
							// launch inequality finder for explanation
							r = edExplFinder.FindEdExplanation(max_char, &insertion_cost, &deletion_cost,
																								 &substitution_cost, seq1, seq2, &dpMatrix,
																								 editDistanceLB, seqSize, min_id_cost);
							break;
					}

					if (!ed.setMin(editDistanceLB, r)) {
						return false;
					}
				}
			}
		}

		return true;
	}